

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_anPrDuDgn(HModel *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = this->dblOption[2];
  if (this->numRow < 1) {
    uVar4 = 0;
    dVar7 = 0.0;
  }
  else {
    dVar8 = this->dblOption[1];
    uVar6 = 0;
    dVar7 = 0.0;
    uVar4 = 0;
    do {
      dVar2 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      dVar7 = dVar7 + dVar2 * dVar2;
      dVar9 = (this->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] - dVar2;
      dVar2 = dVar2 - (this->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
      if (dVar2 <= dVar9) {
        dVar2 = dVar9;
      }
      uVar4 = uVar4 + (ABS(dVar2) < dVar8);
      printf("Basic variable %7d is %7d: [%11.4g, %11.4g, %11.4g] Rsdu = %11.4g; numDgnPrAct = %7d\n"
             ,uVar6 & 0xffffffff,
             (ulong)(uint)(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6],(ulong)uVar4);
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)this->numRow);
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  iVar3 = this->numRow;
  if (this->numTot < 1) {
    uVar5 = 0;
    dVar8 = 0.0;
  }
  else {
    uVar6 = 0;
    dVar8 = 0.0;
    uVar5 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] == 1) {
        dVar2 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        dVar8 = dVar8 + dVar2 * dVar2;
        uVar5 = uVar5 + (ABS(dVar2) < dVar1);
        printf("Variable %7d is nonbasic: %11.4g; numDgnDuAct = %7d\n",uVar6 & 0xffffffff,
               (ulong)uVar5);
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)this->numTot);
  }
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  printf("anPrDuDgn: model %s: ||BcPrAct|| = %g; numDgnPrAct = %d of %d (%7.2f%%); ||NonBcDuAct|| = %g; numDgnDuAct = %d of %d (%7.2f%%)\n"
         ,dVar7,((double)(int)uVar4 * 100.0) / (double)iVar3,dVar8,
         SUB84(((double)(int)uVar5 * 100.0) / (double)this->numCol,0),
         (this->modelName)._M_dataplus._M_p,(ulong)uVar4,(ulong)(uint)this->numRow,(ulong)uVar5);
  printf("GrepAnPrDuDgn,%s,%g,%d,%d,%g,%d,%d\n",dVar7,dVar8,(this->modelName)._M_dataplus._M_p,
         (ulong)uVar4,(ulong)(uint)this->numRow,(ulong)uVar5,(ulong)(uint)this->numCol);
  return;
}

Assistant:

void HModel::util_anPrDuDgn() {
  double normPrAct = 0;
  int numDgnPrAct = 0;
  double normDuAct = 0;
  int numDgnDuAct = 0;
  double TlPrIfs = dblOption[DBLOPT_PRIMAL_TOL];
  double TlDuIfs = dblOption[DBLOPT_DUAL_TOL];
  for (int row=0; row < numRow; row++) {
    double prAct = baseValue[row];
    normPrAct += prAct*prAct;
    double rsdu = max(baseLower[row]-prAct, prAct-baseUpper[row]);
    if (abs(rsdu) < TlPrIfs) {numDgnPrAct++;}
    printf("Basic variable %7d is %7d: [%11.4g, %11.4g, %11.4g] Rsdu = %11.4g; numDgnPrAct = %7d\n",
	   row, basicIndex[row], baseLower[row], prAct, baseUpper[row], rsdu, numDgnPrAct);
  }
  normPrAct = sqrt(normPrAct);
  double pctDgnPrAct = numDgnPrAct;
  pctDgnPrAct = 100*pctDgnPrAct/numRow;

  for (int var=0; var < numTot; var++) {
    if (nonbasicFlag[var] == NONBASIC_FLAG_TRUE) {
      double duAct = workDual[var];
      normDuAct += duAct*duAct;
      if (abs(duAct) < TlDuIfs) {numDgnDuAct++;}
      printf("Variable %7d is nonbasic: %11.4g; numDgnDuAct = %7d\n", var, duAct, numDgnDuAct);
    }
  }
  normDuAct = sqrt(normDuAct);
  double pctDgnDuAct = numDgnDuAct;
  pctDgnDuAct = 100*pctDgnDuAct/numCol;

  printf("anPrDuDgn: model %s: ||BcPrAct|| = %g; numDgnPrAct = %d of %d (%7.2f%%); ||NonBcDuAct|| = %g; numDgnDuAct = %d of %d (%7.2f%%)\n",
	 modelName.c_str(), normPrAct, numDgnPrAct, numRow, pctDgnPrAct, normDuAct, numDgnDuAct, numCol, pctDgnDuAct);
  printf("GrepAnPrDuDgn,%s,%g,%d,%d,%g,%d,%d\n",
	 modelName.c_str(), normPrAct, numDgnPrAct, numRow, normDuAct, numDgnDuAct, numCol);
  
}